

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O3

int __thiscall
re2::ToStringWalker::PostVisit
          (ToStringWalker *this,Regexp *re,int parent_arg,int pre_arg,int *child_args,
          int nchild_args)

{
  size_type sVar1;
  uint uVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  CharClass *this_00;
  string *psVar6;
  Rune *pRVar7;
  long lVar8;
  undefined1 local_1a8 [16];
  undefined1 *local_198 [46];
  
  switch(re->op_) {
  case '\x01':
    psVar6 = this->t_;
    break;
  case '\x02':
    if (3 < parent_arg) {
      return 0;
    }
    psVar6 = this->t_;
    break;
  case '\x03':
    AppendLiteral(this->t_,(re->field_7).rune_,(bool)((byte)re->parse_flags_ & 1));
    goto switchD_001c67a3_default;
  case '\x04':
    if (0 < (re->field_7).field_0.max_) {
      lVar8 = 0;
      do {
        AppendLiteral(this->t_,*(Rune *)((long)&(((re->field_7).field_1.name_)->_M_dataplus)._M_p +
                                        lVar8 * 4),(bool)((byte)re->parse_flags_ & 1));
        lVar8 = lVar8 + 1;
      } while (lVar8 < (re->field_7).field_0.max_);
    }
    if (1 < parent_arg) goto switchD_001c67a3_default;
    goto LAB_001c6a9e;
  case '\x05':
    if (parent_arg < 2) goto LAB_001c6a9e;
    goto switchD_001c67a3_default;
  case '\x06':
    psVar6 = this->t_;
    pcVar3 = (psVar6->_M_dataplus)._M_p;
    sVar4 = psVar6->_M_string_length;
    if (pcVar3[sVar4 - 1] == '|') {
      sVar1 = sVar4 - 1;
      if (sVar4 == 0) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                   sVar1,0);
      }
      psVar6->_M_string_length = sVar1;
      pcVar3[sVar1] = '\0';
    }
    else {
      LogMessage::LogMessage
                ((LogMessage *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/tostring.cc"
                 ,0xbc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a8 + 8),"Bad final char: ",0x10);
      std::ostream::_M_insert<void_const*>(local_1a8 + 8);
      LogMessage::~LogMessage((LogMessage *)local_1a8);
    }
    if (parent_arg < 3) goto LAB_001c6a9e;
    goto switchD_001c67a3_default;
  case '\a':
    psVar6 = this->t_;
    goto LAB_001c6981;
  case '\b':
    psVar6 = this->t_;
    goto LAB_001c6981;
  case '\t':
    psVar6 = this->t_;
LAB_001c6981:
    std::__cxx11::string::append((char *)psVar6);
LAB_001c6986:
    if ((re->parse_flags_ & 0x40) != 0) {
      std::__cxx11::string::append((char *)this->t_);
    }
    if (0 < parent_arg) goto switchD_001c67a3_default;
LAB_001c6a9e:
    psVar6 = this->t_;
    goto LAB_001c6ac7;
  case '\n':
    uVar2 = (re->field_7).field_0.max_;
    if (uVar2 == 0xffffffff) {
      psVar6 = this->t_;
      StringPrintf_abi_cxx11_((string *)local_1a8,"{%d,}",(ulong)(uint)(re->field_7).field_0.min_);
      std::__cxx11::string::_M_append((char *)psVar6,local_1a8._0_8_);
    }
    else {
      psVar6 = this->t_;
      if ((re->field_7).field_0.min_ == uVar2) {
        StringPrintf_abi_cxx11_((string *)local_1a8,"{%d}",(ulong)uVar2);
        std::__cxx11::string::_M_append((char *)psVar6,local_1a8._0_8_);
      }
      else {
        StringPrintf_abi_cxx11_((string *)local_1a8,"{%d,%d}");
        std::__cxx11::string::_M_append((char *)psVar6,local_1a8._0_8_);
      }
    }
    if ((undefined1 **)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_);
    }
    goto LAB_001c6986;
  case '\v':
    psVar6 = this->t_;
    break;
  case '\f':
    psVar6 = this->t_;
    break;
  case '\r':
    psVar6 = this->t_;
    break;
  case '\x0e':
    psVar6 = this->t_;
    break;
  case '\x0f':
    psVar6 = this->t_;
    break;
  case '\x10':
    psVar6 = this->t_;
    break;
  case '\x11':
    psVar6 = this->t_;
    break;
  case '\x12':
    psVar6 = this->t_;
    break;
  case '\x13':
    psVar6 = this->t_;
    break;
  case '\x14':
    psVar6 = this->t_;
    if (*(int *)((re->field_7).field_3.cc_ + 4) != 0) {
      std::__cxx11::string::append((char *)psVar6);
      this_00 = (re->field_7).field_3.cc_;
      bVar5 = CharClass::Contains(this_00,0xfffe);
      if ((bVar5) && (*(int *)(this_00 + 4) != 0x110000)) {
        this_00 = CharClass::Negate(this_00);
        std::__cxx11::string::append((char *)this->t_);
      }
      if (*(int *)(this_00 + 0x10) != 0) {
        pRVar7 = *(Rune **)(this_00 + 8);
        do {
          AppendCCRange(this->t_,*pRVar7,pRVar7[1]);
          pRVar7 = pRVar7 + 2;
        } while (pRVar7 != (Rune *)((long)*(int *)(this_00 + 0x10) * 8 + *(long *)(this_00 + 8)));
      }
      if (this_00 != (re->field_7).field_3.cc_) {
        CharClass::Delete(this_00);
      }
      psVar6 = this->t_;
    }
    break;
  case '\x15':
    std::__cxx11::string::append((char *)this->t_,0x303b64);
  default:
    goto switchD_001c67a3_default;
  }
  std::__cxx11::string::append((char *)psVar6);
switchD_001c67a3_default:
  if (parent_arg == 3) {
    psVar6 = this->t_;
LAB_001c6ac7:
    std::__cxx11::string::append((char *)psVar6);
  }
  return 0;
}

Assistant:

int ToStringWalker::PostVisit(Regexp* re, int parent_arg, int pre_arg,
                              int* child_args, int nchild_args) {
  int prec = parent_arg;
  switch (re->op()) {
    case kRegexpNoMatch:
      // There's no simple symbol for "no match", but
      // [^0-Runemax] excludes everything.
      t_->append("[^\\x00-\\x{10ffff}]");
      break;

    case kRegexpEmptyMatch:
      // Append (?:) to make empty string visible,
      // unless this is already being parenthesized.
      if (prec < PrecEmpty)
        t_->append("(?:)");
      break;

    case kRegexpLiteral:
      AppendLiteral(t_, re->rune(),
                    (re->parse_flags() & Regexp::FoldCase) != 0);
      break;

    case kRegexpLiteralString:
      for (int i = 0; i < re->nrunes(); i++)
        AppendLiteral(t_, re->runes()[i],
                      (re->parse_flags() & Regexp::FoldCase) != 0);
      if (prec < PrecConcat)
        t_->append(")");
      break;

    case kRegexpConcat:
      if (prec < PrecConcat)
        t_->append(")");
      break;

    case kRegexpAlternate:
      // Clumsy but workable: the children all appended |
      // at the end of their strings, so just remove the last one.
      if ((*t_)[t_->size()-1] == '|')
        t_->erase(t_->size()-1);
      else
        LOG(DFATAL) << "Bad final char: " << t_;
      if (prec < PrecAlternate)
        t_->append(")");
      break;

    case kRegexpStar:
      t_->append("*");
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpPlus:
      t_->append("+");
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpQuest:
      t_->append("?");
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpRepeat:
      if (re->max() == -1)
        t_->append(StringPrintf("{%d,}", re->min()));
      else if (re->min() == re->max())
        t_->append(StringPrintf("{%d}", re->min()));
      else
        t_->append(StringPrintf("{%d,%d}", re->min(), re->max()));
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpAnyChar:
      t_->append(".");
      break;

    case kRegexpAnyByte:
      t_->append("\\C");
      break;

    case kRegexpBeginLine:
      t_->append("^");
      break;

    case kRegexpEndLine:
      t_->append("$");
      break;

    case kRegexpBeginText:
      t_->append("(?-m:^)");
      break;

    case kRegexpEndText:
      if (re->parse_flags() & Regexp::WasDollar)
        t_->append("(?-m:$)");
      else
        t_->append("\\z");
      break;

    case kRegexpWordBoundary:
      t_->append("\\b");
      break;

    case kRegexpNoWordBoundary:
      t_->append("\\B");
      break;

    case kRegexpCharClass: {
      if (re->cc()->size() == 0) {
        t_->append("[^\\x00-\\x{10ffff}]");
        break;
      }
      t_->append("[");
      // Heuristic: show class as negated if it contains the
      // non-character 0xFFFE and yet somehow isn't full.
      CharClass* cc = re->cc();
      if (cc->Contains(0xFFFE) && !cc->full()) {
        cc = cc->Negate();
        t_->append("^");
      }
      for (CharClass::iterator i = cc->begin(); i != cc->end(); ++i)
        AppendCCRange(t_, i->lo, i->hi);
      if (cc != re->cc())
        cc->Delete();
      t_->append("]");
      break;
    }

    case kRegexpCapture:
      t_->append(")");
      break;

    case kRegexpHaveMatch:
      // There's no syntax accepted by the parser to generate
      // this node (it is generated by RE2::Set) so make something
      // up that is readable but won't compile.
      t_->append("(?HaveMatch:%d)", re->match_id());
      break;
  }

  // If the parent is an alternation, append the | for it.
  if (prec == PrecAlternate)
    t_->append("|");

  return 0;
}